

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectAddMult(Wlc_Ntk_t *p,Wlc_BstPar_t *pPar,int *pCountA,int *pCountM)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  int local_44;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vBoxIds;
  int *pCountM_local;
  int *pCountA_local;
  Wlc_BstPar_t *pPar_local;
  Wlc_Ntk_t *p_local;
  
  *pCountM = 0;
  *pCountA = 0;
  if ((pPar->nAdderLimit == 0) && (pPar->nMultLimit == 0)) {
    p_local = (Wlc_Ntk_t *)0x0;
  }
  else {
    p_local = (Wlc_Ntk_t *)Vec_IntAlloc(100);
    for (local_44 = 1; iVar1 = Wlc_NtkObjNumMax(p), local_44 < iVar1; local_44 = local_44 + 1) {
      p_00 = Wlc_NtkObj(p,local_44);
      if ((((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x2b) && (pPar->nAdderLimit != 0)) &&
         (iVar1 = Wlc_ObjRange(p_00), pPar->nAdderLimit <= iVar1)) {
        Vec_IntPush((Vec_Int_t *)p_local,local_44);
        *pCountA = *pCountA + 1;
      }
      else if ((((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x2d) && (pPar->nMultLimit != 0)) &&
              (iVar1 = Wlc_ObjRange(p_00), pPar->nMultLimit <= iVar1)) {
        Vec_IntPush((Vec_Int_t *)p_local,local_44);
        *pCountM = *pCountM + 1;
      }
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)p_local);
    if (iVar1 < 1) {
      Vec_IntFree((Vec_Int_t *)p_local);
      p_local = (Wlc_Ntk_t *)0x0;
    }
    else {
      Wlc_NtkCollectBoxes(p,(Vec_Int_t *)p_local);
    }
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectAddMult( Wlc_Ntk_t * p, Wlc_BstPar_t * pPar, int * pCountA, int * pCountM )
{
    Vec_Int_t * vBoxIds;
    Wlc_Obj_t * pObj;  int i;
    *pCountA = *pCountM = 0;
    if ( pPar->nAdderLimit == 0 && pPar->nMultLimit == 0 )
        return NULL;
    vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD && pPar->nAdderLimit && Wlc_ObjRange(pObj) >= pPar->nAdderLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountA)++;
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI && pPar->nMultLimit && Wlc_ObjRange(pObj) >= pPar->nMultLimit )
            Vec_IntPush( vBoxIds, i ), (*pCountM)++;
    }
    if ( Vec_IntSize( vBoxIds ) > 0 )
    {
        Wlc_NtkCollectBoxes( p, vBoxIds );
        return vBoxIds;
    }
    Vec_IntFree( vBoxIds );
    return NULL;
}